

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-pktgen.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint8_t *puVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int buf_id;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t num_sent;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_4278 [504];
  undefined8 uStack_4080;
  long lStack_4078;
  device_stats stats_old;
  undefined1 auStack_70 [8];
  device_stats stats;
  long local_40;
  
  if (argc != 2) {
    uStack_4080 = 0x1013d8;
    printf("Usage: %s <pci bus id>\n",*argv);
    return 1;
  }
  lVar6 = 0;
  uStack_4080 = 0x1011ea;
  stats.tx_bytes = memory_allocate_mempool(0x800,0);
  do {
    uStack_4080 = 0x1011fa;
    lVar4 = pkt_buf_alloc(stats.tx_bytes);
    *(undefined4 *)(lVar4 + 0x14) = 0x3c;
    builtin_memcpy((uint8_t *)(lVar4 + 0x40),"\x01\x02\x03\x04\x05\x06\x11\x12",8);
    puVar1 = (uint8_t *)(lVar4 + 0x48);
    builtin_memcpy(puVar1,"\x13\x14\x15\x16\b",6);
    puVar1[6] = 'E';
    puVar1[7] = '\0';
    puVar1 = (uint8_t *)(lVar4 + 0x50);
    puVar1[0] = '\0';
    puVar1[1] = '.';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '@';
    puVar1[7] = '\x11';
    puVar1 = (uint8_t *)(lVar4 + 0x58);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\n';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\x01';
    puVar1[6] = '\n';
    puVar1[7] = '\0';
    puVar1 = (uint8_t *)(lVar4 + 0x4d);
    puVar1[0] = '\0';
    puVar1[1] = 'E';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '.';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uint8_t *)(lVar4 + 0x55);
    puVar1[0] = '\0';
    puVar1[1] = '@';
    puVar1[2] = '\x11';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\n';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uint8_t *)(lVar4 + 0x5d);
    puVar1[0] = '\x01';
    puVar1[1] = '\n';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\x02';
    puVar1[5] = '\0';
    puVar1[6] = '*';
    puVar1[7] = '\x05';
    puVar1 = (uint8_t *)(lVar4 + 0x65);
    puVar1[0] = '9';
    puVar1[1] = '\0';
    puVar1[2] = '\x1a';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = 'i';
    puVar1[6] = 'x';
    puVar1[7] = 'y';
    lVar5 = 0x27;
    uVar9 = 0;
    do {
      uVar8 = *(ushort *)(lVar4 + lVar5 * 2) + uVar9;
      uVar9 = (uVar8 & 0xffff) + 1;
      if (uVar8 < 0x10000) {
        uVar9 = uVar8;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x31);
    *(ushort *)(lVar4 + 0x58) = ~(ushort)uVar9;
    (&lStack_4078)[lVar6] = lVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x800);
  lVar6 = 0;
  do {
    uStack_4080 = 0x10126b;
    pkt_buf_free((&lStack_4078)[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x800);
  uStack_4080 = 0x10128a;
  lVar6 = ixy_init(argv[1],1,1);
  uStack_4080 = 0x101294;
  local_40 = monotonic_time();
  uStack_4080 = 0x1012a4;
  stats_init(auStack_70,lVar6);
  uStack_4080 = 0x1012b3;
  stats_init(&lStack_4078,lVar6);
  uVar7 = 0;
  do {
    do {
      pkt_buf_alloc_batch(stats.tx_bytes,local_4278,0x40);
      auVar11 = vpbroadcastd_avx512vl();
      auVar11 = vpaddd_avx(auVar11,_DAT_00102010);
      lVar4 = 0;
      auVar12._8_4_ = 4;
      auVar12._0_8_ = 0x400000004;
      auVar12._12_4_ = 4;
      do {
        vpscatterqd_avx512vl
                  (ZEXT816(0x78) + SUB3216(*(undefined1 (*) [32])(local_4278 + lVar4 * 8),0),0xffff,
                   auVar11);
        lVar4 = lVar4 + 4;
        auVar11 = vpaddd_avx(auVar11,auVar12);
      } while (lVar4 != 0x40);
      uVar10 = 0;
      do {
        iVar3 = (**(code **)(lVar6 + 0x20))(lVar6,0,local_4278 + uVar10 * 8,0x40 - (int)uVar10);
        uVar9 = (int)uVar10 + iVar3;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != 0x40);
      uVar10 = uVar7 + 1;
      uVar2 = uVar7 & 0xfff;
      uVar7 = uVar10;
    } while (uVar2 != 0);
    lVar4 = monotonic_time();
    if (1000000000 < (ulong)(lVar4 - local_40)) {
      (**(code **)(lVar6 + 0x28))(lVar6,auStack_70);
      print_stats_diff(auStack_70,&lStack_4078,lVar4 - local_40);
      local_40 = lVar4;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 2) {
		printf("Usage: %s <pci bus id>\n", argv[0]);
		return 1;
	}

	struct mempool* mempool = init_mempool();
	struct ixy_device* dev = ixy_init(argv[1], 1, 1);

	uint64_t last_stats_printed = monotonic_time();
	uint64_t counter = 0;
	struct device_stats stats_old, stats;
	stats_init(&stats, dev);
	stats_init(&stats_old, dev);
	uint32_t seq_num = 0;

	// array of bufs sent out in a batch
	struct pkt_buf* bufs[BATCH_SIZE];

	// tx loop
	while (true) {
		// we cannot immediately recycle packets, we need to allocate new packets every time
		// the old packets might still be used by the NIC: tx is async
		pkt_buf_alloc_batch(mempool, bufs, BATCH_SIZE);
		for (uint32_t i = 0; i < BATCH_SIZE; i++) {
			// packets can be modified here, make sure to update the checksum when changing the IP header
			*(uint32_t*)(bufs[i]->data + PKT_SIZE - 4) = seq_num++;
		}
		// the packets could be modified here to generate multiple flows
		ixy_tx_batch_busy_wait(dev, 0, bufs, BATCH_SIZE);

		// don't check time for every packet, this yields +10% performance :)
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev, &stats);
				print_stats_diff(&stats, &stats_old, time - last_stats_printed);
				stats_old = stats;
				last_stats_printed = time;
			}
		}
		// track stats
	}
	return 0;
}